

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textSubtitlesRender.cpp
# Opt level: O0

vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
text_subtitles::TextSubtitlesRender::processTxtLine
          (vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,TextSubtitlesRender *this,string *line,
          vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_> *fontStack)

{
  int iVar1;
  undefined8 uVar2;
  bool bVar3;
  wint_t wVar4;
  int32_t iVar5;
  int iVar6;
  size_type sVar7;
  reference pvVar8;
  ulong uVar9;
  char *pcVar10;
  size_t sVar11;
  pointer pvVar12;
  reference ppVar13;
  bool local_3d3;
  pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *i_1;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  double rSize;
  undefined1 local_358 [8];
  string msg;
  undefined1 local_318 [8];
  string arg_1;
  string local_2f0;
  size_t local_2d0;
  size_t fontSizePos;
  string local_2a8 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
  local_288;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
  local_280;
  const_iterator it;
  undefined1 local_258 [8];
  string arg;
  string local_230;
  size_t local_210;
  size_t colorPos;
  string local_1e8;
  allocator<char> local_1c1;
  string local_1c0;
  allocator<char> local_199;
  string local_198;
  size_t local_178;
  size_t fontNamePos;
  string local_168;
  byte local_143;
  byte local_142;
  allocator<char> local_141;
  string local_140;
  reference local_120;
  char *j;
  iterator __end4;
  iterator __begin4;
  string *__range4;
  string ltagStr;
  string local_d0;
  undefined1 local_b0 [8];
  string tagStr;
  bool endTag;
  ulong uStack_88;
  bool isTag;
  size_t i;
  ulong uStack_78;
  bool bStartFound;
  size_t bStartPos;
  size_t prevTextPos;
  undefined1 local_60 [8];
  Font curFont;
  vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_> *fontStack_local;
  string *line_local;
  TextSubtitlesRender *this_local;
  vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *rez;
  
  curFont._48_8_ = fontStack;
  bVar3 = std::vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>::empty(fontStack)
  ;
  if (bVar3) {
    std::vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>::push_back
              ((vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_> *)curFont._48_8_
               ,&this->m_font);
    pvVar8 = std::vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>::operator[]
                       ((vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_> *)
                        curFont._48_8_,0);
    pvVar8->m_size = 3;
  }
  uVar2 = curFont._48_8_;
  sVar7 = std::vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>::size
                    ((vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_> *)
                     curFont._48_8_);
  pvVar8 = std::vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>::operator[]
                     ((vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_> *)uVar2,
                      sVar7 - 1);
  Font::Font((Font *)local_60,pvVar8);
  std::
  vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(__return_storage_ptr__);
  bStartPos = 0;
  uStack_78 = 0;
  bVar3 = false;
  for (uStack_88 = 0; uVar9 = std::__cxx11::string::size(), uStack_88 < uVar9;
      uStack_88 = uStack_88 + 1) {
    pcVar10 = (char *)std::__cxx11::string::operator[]((ulong)line);
    if (*pcVar10 == '<') {
      uStack_78 = uStack_88;
      bVar3 = true;
    }
    else {
      pcVar10 = (char *)std::__cxx11::string::operator[]((ulong)line);
      if ((*pcVar10 == '>') && (bVar3)) {
        tagStr.field_2._M_local_buf[0xf] = '\0';
        tagStr.field_2._M_local_buf[0xe] = '\0';
        std::__cxx11::string::substr((ulong)&local_d0,(ulong)line);
        trimStr((string *)local_b0,&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::string((string *)&__range4,(string *)local_b0);
        __end4._M_current = (char *)std::__cxx11::string::begin();
        j = (char *)std::__cxx11::string::end();
        while (bVar3 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                           *)&j), bVar3) {
          local_120 = __gnu_cxx::
                      __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ::operator*(&__end4);
          wVar4 = towlower((int)*local_120);
          *local_120 = (char)wVar4;
          __gnu_cxx::
          __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator++(&__end4);
        }
        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&__range4,"i");
        if ((bVar3) ||
           (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&__range4,"italic"), bVar3)) {
          curFont.m_name.field_2._12_4_ = curFont.m_name.field_2._12_4_ | 2;
          tagStr.field_2._M_local_buf[0xf] = '\x01';
        }
        else {
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&__range4,"b");
          if ((bVar3) ||
             (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&__range4,"bold"), bVar3)) {
            curFont.m_name.field_2._12_4_ = curFont.m_name.field_2._12_4_ | 1;
            tagStr.field_2._M_local_buf[0xf] = '\x01';
          }
          else {
            bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&__range4,"u");
            if ((bVar3) ||
               (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&__range4,"underline"), bVar3)) {
              curFont.m_name.field_2._12_4_ = curFont.m_name.field_2._12_4_ | 4;
              tagStr.field_2._M_local_buf[0xf] = '\x01';
            }
            else {
              bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&__range4,"f");
              if ((bVar3) ||
                 (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&__range4,"force"), bVar3)) {
                curFont.m_name.field_2._12_4_ = curFont.m_name.field_2._12_4_ | 0x10;
                tagStr.field_2._M_local_buf[0xf] = '\x01';
              }
              else {
                bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&__range4,"strike");
                if (bVar3) {
                  curFont.m_name.field_2._12_4_ = curFont.m_name.field_2._12_4_ | 8;
                  tagStr.field_2._M_local_buf[0xf] = '\x01';
                }
                else {
                  local_142 = 0;
                  local_143 = 0;
                  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&__range4,"/i");
                  local_3d3 = true;
                  if (!bVar3) {
                    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&__range4,"/italic");
                    local_3d3 = true;
                    if (!bVar3) {
                      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)&__range4,"/b");
                      local_3d3 = true;
                      if (!bVar3) {
                        bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)&__range4,"/bold");
                        local_3d3 = true;
                        if (!bVar3) {
                          bVar3 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&__range4,"/u");
                          local_3d3 = true;
                          if (!bVar3) {
                            bVar3 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&__range4,"/underline");
                            local_3d3 = true;
                            if (!bVar3) {
                              bVar3 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&__range4,"/f");
                              local_3d3 = true;
                              if (!bVar3) {
                                bVar3 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&__range4,"/force");
                                local_3d3 = true;
                                if (!bVar3) {
                                  bVar3 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&__range4,"/strike");
                                  local_3d3 = true;
                                  if (!bVar3) {
                                    std::allocator<char>::allocator();
                                    local_142 = 1;
                                    std::__cxx11::string::string<std::allocator<char>>
                                              ((string *)&local_140,"/font",&local_141);
                                    local_143 = 1;
                                    local_3d3 = strStartWith((string *)local_b0,&local_140);
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  if ((local_143 & 1) != 0) {
                    std::__cxx11::string::~string((string *)&local_140);
                  }
                  if ((local_142 & 1) != 0) {
                    std::allocator<char>::~allocator(&local_141);
                  }
                  if (local_3d3 == false) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_168,"font ",
                               (allocator<char> *)((long)&fontNamePos + 7));
                    bVar3 = strStartWith((string *)&__range4,&local_168);
                    std::__cxx11::string::~string((string *)&local_168);
                    std::allocator<char>::~allocator((allocator<char> *)((long)&fontNamePos + 7));
                    if (bVar3) {
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_198,"name",&local_199);
                      sVar11 = anon_unknown.dwarf_20d926::findUnquotedStr
                                         ((string *)&__range4,&local_198);
                      std::__cxx11::string::~string((string *)&local_198);
                      std::allocator<char>::~allocator(&local_199);
                      local_178 = sVar11;
                      if (sVar11 == 0xffffffffffffffff) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_1c0,"face",&local_1c1);
                        local_178 = anon_unknown.dwarf_20d926::findUnquotedStr
                                              ((string *)&__range4,&local_1c0);
                        std::__cxx11::string::~string((string *)&local_1c0);
                        std::allocator<char>::~allocator(&local_1c1);
                      }
                      if (local_178 != 0xffffffffffffffff) {
                        findFontArg((string *)&colorPos,(string *)local_b0,local_178);
                        unquoteStr(&local_1e8,(string *)&colorPos);
                        std::__cxx11::string::operator=((string *)local_60,(string *)&local_1e8);
                        std::__cxx11::string::~string((string *)&local_1e8);
                        std::__cxx11::string::~string((string *)&colorPos);
                      }
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_230,"color",
                                 (allocator<char> *)(arg.field_2._M_local_buf + 0xf));
                      sVar11 = anon_unknown.dwarf_20d926::findUnquotedStr
                                         ((string *)&__range4,&local_230);
                      std::__cxx11::string::~string((string *)&local_230);
                      std::allocator<char>::~allocator
                                ((allocator<char> *)(arg.field_2._M_local_buf + 0xf));
                      local_210 = sVar11;
                      if (sVar11 != 0xffffffffffffffff) {
                        findFontArg((string *)&it,(string *)&__range4,sVar11);
                        unquoteStr((string *)local_258,(string *)&it);
                        std::__cxx11::string::~string((string *)&it);
                        local_280._M_cur =
                             (__node_type *)
                             std::
                             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                             ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                     *)(anonymous_namespace)::defaultPallette_abi_cxx11_,
                                    (key_type *)local_258);
                        local_288._M_cur =
                             (__node_type *)
                             std::
                             end<std::unordered_map<std::__cxx11::string,unsigned_int,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>>
                                       ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                         *)(anonymous_namespace)::defaultPallette_abi_cxx11_);
                        bVar3 = std::__detail::operator!=(&local_280,&local_288);
                        if (bVar3) {
                          pvVar12 = std::__detail::
                                    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_false,_true>
                                    ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_false,_true>
                                                  *)&local_280);
                          curFont.m_borderWidth = (float)pvVar12->second;
                          uVar9 = std::__cxx11::string::empty();
                          if (((uVar9 & 1) == 0) &&
                             ((pcVar10 = (char *)std::__cxx11::string::operator[]((ulong)local_258),
                              *pcVar10 == '#' ||
                              (pcVar10 = (char *)std::__cxx11::string::operator[]((ulong)local_258),
                              *pcVar10 == 'x')))) {
                            std::__cxx11::string::substr((ulong)local_2a8,(ulong)local_258);
                            pcVar10 = (char *)std::__cxx11::string::c_str();
                            curFont.m_borderWidth = (float)strToInt32u(pcVar10,0x10);
                            std::__cxx11::string::~string(local_2a8);
                          }
                          else {
                            uVar9 = std::__cxx11::string::size();
                            if ((uVar9 < 2) ||
                               ((pcVar10 = (char *)std::__cxx11::string::operator[]
                                                             ((ulong)local_258), *pcVar10 != '0' &&
                                (pcVar10 = (char *)std::__cxx11::string::operator[]
                                                             ((ulong)local_258), *pcVar10 != 'x'))))
                            {
                              pcVar10 = (char *)std::__cxx11::string::c_str();
                              curFont.m_borderWidth = (float)strToInt32u(pcVar10,10);
                            }
                            else {
                              std::__cxx11::string::substr((ulong)&fontSizePos,(ulong)local_258);
                              pcVar10 = (char *)std::__cxx11::string::c_str();
                              curFont.m_borderWidth = (float)strToInt32u(pcVar10,0x10);
                              std::__cxx11::string::~string((string *)&fontSizePos);
                            }
                          }
                        }
                        if (((uint)curFont.m_borderWidth & 0xff000000) == 0) {
                          curFont.m_borderWidth = (float)((uint)curFont.m_borderWidth | 0xff000000);
                        }
                        std::__cxx11::string::~string((string *)local_258);
                      }
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_2f0,"size",
                                 (allocator<char> *)(arg_1.field_2._M_local_buf + 0xf));
                      sVar11 = anon_unknown.dwarf_20d926::findUnquotedStr
                                         ((string *)&__range4,&local_2f0);
                      std::__cxx11::string::~string((string *)&local_2f0);
                      std::allocator<char>::~allocator
                                ((allocator<char> *)(arg_1.field_2._M_local_buf + 0xf));
                      local_2d0 = sVar11;
                      if (sVar11 != 0xffffffffffffffff) {
                        findFontArg((string *)((long)&msg.field_2 + 8),(string *)local_b0,sVar11);
                        unquoteStr((string *)local_318,(string *)((long)&msg.field_2 + 8));
                        std::__cxx11::string::~string((string *)(msg.field_2._M_local_buf + 8));
                        uVar9 = std::__cxx11::string::empty();
                        if ((uVar9 & 1) == 0) {
                          pcVar10 = (char *)std::__cxx11::string::operator[]((ulong)local_318);
                          if ((*pcVar10 == '+') ||
                             (pcVar10 = (char *)std::__cxx11::string::operator[]((ulong)local_318),
                             *pcVar10 == '-')) {
                            pcVar10 = (char *)std::__cxx11::string::c_str();
                            iVar5 = strToInt32(pcVar10,10);
                            curFont.m_name.field_2._8_4_ = iVar5 + curFont.m_name.field_2._8_4_;
                          }
                          else {
                            pcVar10 = (char *)std::__cxx11::string::c_str();
                            curFont.m_name.field_2._8_4_ = strToInt32(pcVar10,10);
                          }
                        }
                        std::__cxx11::string::~string((string *)local_318);
                      }
                      tagStr.field_2._M_local_buf[0xf] = '\x01';
                    }
                  }
                  else {
                    tagStr.field_2._M_local_buf[0xe] = '\x01';
                  }
                }
              }
            }
          }
        }
        if (((tagStr.field_2._M_local_buf[0xf] & 1U) != 0) ||
           ((tagStr.field_2._M_local_buf[0xe] & 1U) != 0)) {
          if (bStartPos < uStack_78) {
            std::__cxx11::string::substr((ulong)local_358,(ulong)line);
            uVar2 = curFont._48_8_;
            sVar7 = std::vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>::size
                              ((vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>
                                *)curFont._48_8_);
            pvVar8 = std::vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>::
                     operator[]((vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>
                                 *)uVar2,sVar7 - 1);
            std::
            vector<std::pair<text_subtitles::Font,std::__cxx11::string>,std::allocator<std::pair<text_subtitles::Font,std::__cxx11::string>>>
            ::emplace_back<text_subtitles::Font&,std::__cxx11::string&>
                      ((vector<std::pair<text_subtitles::Font,std::__cxx11::string>,std::allocator<std::pair<text_subtitles::Font,std::__cxx11::string>>>
                        *)__return_storage_ptr__,pvVar8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_358);
            std::__cxx11::string::~string((string *)local_358);
          }
          if ((tagStr.field_2._M_local_buf[0xf] & 1U) == 0) {
            sVar7 = std::vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>::size
                              ((vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>
                                *)curFont._48_8_);
            uVar2 = curFont._48_8_;
            if (1 < sVar7) {
              sVar7 = std::vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>::size
                                ((vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>
                                  *)curFont._48_8_);
              std::vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>::resize
                        ((vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_> *)
                         uVar2,sVar7 - 1);
              uVar2 = curFont._48_8_;
              sVar7 = std::vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>::size
                                ((vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>
                                  *)curFont._48_8_);
              pvVar8 = std::vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>::
                       operator[]((vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>
                                   *)uVar2,sVar7 - 1);
              Font::operator=((Font *)local_60,pvVar8);
            }
          }
          else {
            std::vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_>::push_back
                      ((vector<text_subtitles::Font,_std::allocator<text_subtitles::Font>_> *)
                       curFont._48_8_,(value_type *)local_60);
          }
          bStartPos = uStack_88 + 1;
        }
        bVar3 = false;
        std::__cxx11::string::~string((string *)&__range4);
        std::__cxx11::string::~string((string *)local_b0);
      }
    }
  }
  uVar9 = std::__cxx11::string::size();
  if ((bStartPos & 0xffffffff) < uVar9) {
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)&rSize,(ulong)line);
    std::
    vector<std::pair<text_subtitles::Font,std::__cxx11::string>,std::allocator<std::pair<text_subtitles::Font,std::__cxx11::string>>>
    ::emplace_back<text_subtitles::Font&,std::__cxx11::string>
              ((vector<std::pair<text_subtitles::Font,std::__cxx11::string>,std::allocator<std::pair<text_subtitles::Font,std::__cxx11::string>>>
                *)__return_storage_ptr__,(Font *)local_60,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rSize);
    std::__cxx11::string::~string((string *)&rSize);
  }
  iVar1 = (this->m_initFont).m_size;
  __end1 = std::
           vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(__return_storage_ptr__);
  i_1 = (pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)std::
           vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end(__return_storage_ptr__);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     *)&i_1), bVar3) {
    ppVar13 = __gnu_cxx::
              __normal_iterator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::operator*(&__end1);
    iVar6 = browserSizeToRealSize((ppVar13->first).m_size,(double)iVar1);
    (ppVar13->first).m_size = iVar6;
    __gnu_cxx::
    __normal_iterator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<text_subtitles::Font,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::operator++(&__end1);
  }
  Font::~Font((Font *)local_60);
  return __return_storage_ptr__;
}

Assistant:

vector<pair<Font, string>> TextSubtitlesRender::processTxtLine(const std::string& line, vector<Font>& fontStack) const
{
    if (fontStack.empty())
    {
        fontStack.push_back(m_font);
        fontStack[0].m_size = DEFAULT_BROWSER_STYLE_FS;
    }
    Font curFont = fontStack[fontStack.size() - 1];

    vector<pair<Font, string>> rez;
    size_t prevTextPos = 0;
    size_t bStartPos = 0;
    bool bStartFound = false;
    for (size_t i = 0; i < line.size(); i++)
    {
        if (line[i] == '<')
        {
            bStartPos = i;
            bStartFound = true;
        }
        else if (line[i] == '>' && bStartFound)
        {
            bool isTag = false;
            bool endTag = false;
            string tagStr = trimStr(line.substr(bStartPos + 1, i - bStartPos - 1));
            string ltagStr = tagStr;
            for (auto& j : ltagStr) j = static_cast<char>(towlower(j));
            if (ltagStr == "i" || ltagStr == "italic")
            {
                curFont.m_opts |= Font::ITALIC;
                isTag = true;
            }
            else if (ltagStr == "b" || ltagStr == "bold")
            {
                curFont.m_opts |= Font::BOLD;
                isTag = true;
            }
            else if (ltagStr == "u" || ltagStr == "underline")
            {
                curFont.m_opts |= Font::UNDERLINE;
                isTag = true;
            }
            else if (ltagStr == "f" || ltagStr == "force")
            {
                curFont.m_opts |= Font::FORCED;
                isTag = true;
            }
            else if (ltagStr == "strike")
            {
                curFont.m_opts |= Font::STRIKE_OUT;
                isTag = true;
            }
            else if ((ltagStr == "/i" || ltagStr == "/italic") || (ltagStr == "/b" || ltagStr == "/bold") ||
                     (ltagStr == "/u" || ltagStr == "/underline") || (ltagStr == "/f" || ltagStr == "/force") ||
                     ltagStr == "/strike" || strStartWith(tagStr, "/font"))
            {
                endTag = true;
            }
            else if (strStartWith(ltagStr, "font "))
            {
                size_t fontNamePos = findUnquotedStr(ltagStr, "name");  // ltagStr.find("name");
                if (fontNamePos == string::npos)
                    fontNamePos = findUnquotedStr(ltagStr, "face");
                if (fontNamePos != string::npos)
                    curFont.m_name = unquoteStr(findFontArg(tagStr, fontNamePos /*, lastIndexPos*/));

                size_t colorPos = findUnquotedStr(ltagStr, "color");
                if (colorPos != string::npos)
                {
                    auto arg = unquoteStr(findFontArg(ltagStr, colorPos));
                    auto it = defaultPallette.find(arg);
                    if (it != std::end(defaultPallette))
                    {
                        curFont.m_color = it->second;
                        if (!arg.empty() && (arg[0] == '#' || arg[0] == 'x'))
                            curFont.m_color = strToInt32u(arg.substr(1, 16384).c_str(), 16);
                        else if (arg.size() > 1 && (arg[0] == '0' || arg[1] == 'x'))
                            curFont.m_color = strToInt32u(arg.substr(2, 16384).c_str(), 16);
                        else
                            curFont.m_color = strToInt32u(arg.c_str(), 10);
                    }
                    if ((curFont.m_color & 0xff000000u) == 0)
                        curFont.m_color |= 0xff000000u;
                }
                size_t fontSizePos = findUnquotedStr(ltagStr, "size");
                if (fontSizePos != string::npos)
                {
                    string arg = unquoteStr(findFontArg(tagStr, fontSizePos));
                    if (!arg.empty())
                    {
                        if (arg[0] == '+' || arg[0] == '-')
                            curFont.m_size += strToInt32(arg.c_str(), 10);
                        else
                            curFont.m_size = strToInt32(arg.c_str(), 10);
                    }
                }
                isTag = true;
            }
            if (isTag || endTag)
            {
                if (bStartPos > prevTextPos)
                {
                    string msg = line.substr(prevTextPos, bStartPos - prevTextPos);
                    rez.emplace_back(fontStack[fontStack.size() - 1], msg);
                }
                if (isTag)
                    fontStack.push_back(curFont);
                else if (fontStack.size() > 1)
                {
                    fontStack.resize(fontStack.size() - 1);
                    curFont = fontStack[fontStack.size() - 1];
                }
                prevTextPos = i + 1;
            }
            bStartFound = false;
        }
    }
    if (line.size() > static_cast<unsigned>(prevTextPos))
        rez.emplace_back(curFont, line.substr(prevTextPos, line.size() - prevTextPos));
    double rSize = m_initFont.m_size;
    for (auto& i : rez) i.first.m_size = browserSizeToRealSize(i.first.m_size, rSize);
    return rez;
}